

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

void __thiscall CGlyphMap::CGlyphMap(CGlyphMap *this,IGraphics *pGraphics,FT_Library FtLibrary)

{
  CGlyphMap *pCVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint in_stack_ffffffffffffff6c;
  void *in_stack_ffffffffffffff70;
  CAtlas *in_stack_ffffffffffffff80;
  CGlyphMap *this_00;
  CGlyphMap *local_50;
  CTextureHandle *local_30;
  
  local_30 = (CTextureHandle *)(in_RDI + 2);
  do {
    IGraphics::CTextureHandle::CTextureHandle(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (CTextureHandle *)(in_RDI + 3));
  this_00 = (CGlyphMap *)(in_RDI + 3);
  pCVar1 = this_00;
  do {
    local_50 = pCVar1;
    CAtlas::CAtlas(in_stack_ffffffffffffff80);
    pCVar1 = (CGlyphMap *)&local_50->m_aAtlasPages[0].m_Height;
  } while (pCVar1 != (CGlyphMap *)(in_RDI + 99));
  sorted_array<CGlyphIndex,_allocator_default<CGlyphIndex>_>::sorted_array
            ((sorted_array<CGlyphIndex,_allocator_default<CGlyphIndex>_> *)0x14059d);
  *in_RDI = in_RSI;
  FT_Stroker_New(in_RDX,in_RDI + 1);
  in_RDI[0x67] = 0;
  in_RDI[0x68] = 0;
  mem_zero(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  mem_zero(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  *(undefined4 *)(in_RDI + 0x8a) = 0;
  *(undefined4 *)(in_RDI + 0x79) = 0;
  *(undefined4 *)(in_RDI + 0x66) = 0;
  InitTexture(this_00,(int)((ulong)local_50 >> 0x20),(int)local_50);
  return;
}

Assistant:

CGlyphMap::CGlyphMap(IGraphics *pGraphics, FT_Library FtLibrary)
{
	m_pGraphics = pGraphics;

	FT_Stroker_New(FtLibrary, &m_FtStroker);

	m_DefaultFace = NULL;
	m_VariantFace = NULL;

	mem_zero(m_aFallbackFaces, sizeof(m_aFallbackFaces));
	mem_zero(m_aFtFaces, sizeof(m_aFtFaces));

	m_NumFtFaces = 0;
	m_NumFallbackFaces = 0;
	m_NumTotalPages = 0;

	InitTexture(TEXTURE_SIZE, TEXTURE_SIZE);
}